

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt64(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this,int64_t i64)

{
  char *pcVar1;
  char *p;
  Ch *pCVar2;
  char buffer [21];
  Ch local_38 [32];
  
  pcVar1 = internal::i64toa(i64,local_38);
  for (pCVar2 = local_38; pCVar2 != pcVar1; pCVar2 = pCVar2 + 1) {
    BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put(this->os_,*pCVar2);
  }
  return true;
}

Assistant:

bool WriteInt64(int64_t i64) {
        char buffer[21];
        const char* end = internal::i64toa(i64, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }